

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
           *this)

{
  bool bVar1;
  iterator *in_RDI;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__n_>_>
  *unaff_retaddr;
  bool local_12;
  bool local_11;
  iterator *it;
  
  it = in_RDI;
  while( true ) {
    local_11 = false;
    if (in_RDI->pos != in_RDI->end) {
      bVar1 = dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
              ::test_empty(unaff_retaddr,it);
      local_12 = true;
      if (!bVar1) {
        local_12 = dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\n'>_>
                   ::test_deleted(unaff_retaddr,it);
      }
      local_11 = local_12;
    }
    if (local_11 == false) break;
    in_RDI->pos = in_RDI->pos + 1;
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }